

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeDee.cpp
# Opt level: O3

void TeeDee::CalcPattern(Data *data)

{
  float fVar1;
  uint uVar2;
  int i;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  fVar1 = data->p[0];
  uVar2 = (int)fVar1 * 1000;
  uVar3 = 0;
  do {
    switch((int)fVar1) {
    case 0:
      bVar5 = (uVar3 & 3) == 0;
      goto LAB_0011908b;
    case 1:
      bVar5 = ((uint)uVar3 & 7) == 4;
      goto LAB_0011908b;
    case 2:
      bVar5 = (uVar3 & 6) == 0;
LAB_0011908b:
      uVar4 = (uint)bVar5;
      break;
    case 3:
      uVar4 = 0;
      break;
    case 4:
      uVar4 = 1;
      break;
    default:
      uVar2 = uVar2 * 0x19660d + 0x3c6ef35f;
      uVar4 = (uVar2 >> 0x10 ^ uVar2) & 1;
    }
    data->pattern[uVar3] = uVar4;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x40) {
      return;
    }
  } while( true );
}

Assistant:

static void CalcPattern(EffectData::Data* data)
    {
        int seed = (int)data->p[P_SEED];
        Random random;
        random.Seed((unsigned long)(seed * 1000));
        for (int i = 0; i < 64; i++)
        {
            switch (seed)
            {
                case 0: data->pattern[i] = ((i & 3) ==  0) ? 1 : 0; break;
                case 1: data->pattern[i] = ((i & 7) ==  4) ? 1 : 0; break;
                case 2: data->pattern[i] = ((i & 7) <   2) ? 1 : 0; break;
                case 3: data->pattern[i] = ((i & 7) == 12) ? 1 : 0; break;
                case 4: data->pattern[i] = 1; break;
                default: data->pattern[i] = random.Get() & 1;
            }
        }
    }